

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateStaticVariablesInitialization
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  ObjectiveCType OVar2;
  EnumDescriptor *this_00;
  Descriptor *this_01;
  AlphaNum *in_RCX;
  Descriptor *in_RDX;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  EnumDescriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar3;
  string_view class_name;
  string_view class_name_00;
  allocator<char> local_af3;
  allocator<char> local_af2;
  allocator<char> local_af1;
  allocator<char> local_af0;
  allocator<char> local_aef;
  allocator<char> local_aee;
  allocator<char> local_aed;
  allocator<char> local_aec;
  allocator<char> local_aeb;
  allocator<char> local_aea;
  allocator<char> local_ae9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  int local_ac4;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string containing_type;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string_view local_820 [3];
  size_type local_7f0;
  pointer local_7e8;
  AlphaNum local_7c0;
  AlphaNum local_790;
  Sub local_760 [4];
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  ClassName_abi_cxx11_(&containing_type,(objectivec *)this->descriptor_->containing_type_,in_RDX);
  OVar2 = GetObjectiveCType(this->descriptor_);
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_760,"GPBExtensionRepeated",(allocator<char> *)&local_7f0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&options,
               &local_760[0].key_);
    std::__cxx11::string::~string((string *)local_760);
  }
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_760,"GPBExtensionPacked",(allocator<char> *)&local_7f0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&options,
               &local_760[0].key_);
    std::__cxx11::string::~string((string *)local_760);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"default",&local_ae9);
  bVar1 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a20,"nil",&local_aea);
  }
  else {
    DefaultValue_abi_cxx11_(&local_a20,(objectivec *)this->descriptor_,field);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(local_760,&local_840,&local_a20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"default_name",&local_aeb)
  ;
  GPBGenericValueFieldName_abi_cxx11_(&local_880,(objectivec *)this->descriptor_,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_760 + 1,&local_860,&local_880);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"enum_desc_func_name",&local_aec);
  if (OVar2 == OBJECTIVECTYPE_ENUM) {
    this_00 = FieldDescriptor::enum_type(this->descriptor_);
    EnumName_abi_cxx11_(&local_aa0,(objectivec *)this_00,descriptor);
    local_7f0 = local_aa0._M_string_length;
    local_7e8 = local_aa0._M_dataplus._M_p;
    local_790.piece_ = absl::lts_20250127::NullSafeStringView("_EnumDescriptor");
    in_RCX = &local_790;
    absl::lts_20250127::StrCat_abi_cxx11_(&local_a40,(lts_20250127 *)&local_7f0,in_RCX,in_RCX);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"NULL",(allocator<char> *)&local_aa0);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(local_760 + 2,&local_8a0,&local_a40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c0,"extended_type",&local_aed);
  class_name._M_str = (char *)in_RCX;
  class_name._M_len = (size_t)containing_type._M_dataplus._M_p;
  ObjCClass_abi_cxx11_(&local_8e0,(objectivec *)containing_type._M_string_length,class_name);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_760 + 3,&local_8c0,&local_8e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"extension_type",&local_aee);
  local_820[0] = absl::lts_20250127::NullSafeStringView("GPBDataType");
  GetCapitalizedType_abi_cxx11_
            (&local_a60,(objectivec *)this->descriptor_,(FieldDescriptor *)local_820[0]._M_str);
  local_7c0.piece_._M_len = local_a60._M_string_length;
  local_7c0.piece_._M_str = local_a60._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_920,(lts_20250127 *)local_820,&local_7c0,(AlphaNum *)local_a60._M_string_length)
  ;
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_480,&local_900,&local_920);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"method_name",&local_aef);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3c8,&local_940,&this->method_name_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"number",&local_af0);
  local_ac4 = this->descriptor_->number_;
  io::Printer::Sub::Sub<int>(&local_310,&local_960,&local_ac4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"options",&local_af1);
  BuildFlagsString(&local_9a0,FLAGTYPE_EXTENSION,&options);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_980,&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"root_or_message_class_name",&local_af2);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>
            (&local_1a0,&local_9c0,&this->root_or_message_class_name_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"type",&local_af3);
  if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
    this_01 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_(&local_ac0,(objectivec *)this_01,descriptor_00);
    class_name_00._M_str = (char *)local_a60._M_string_length;
    class_name_00._M_len = (size_t)local_ac0._M_dataplus._M_p;
    ObjCClass_abi_cxx11_(&local_a80,(objectivec *)local_ac0._M_string_length,class_name_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"Nil",(allocator<char> *)&local_ac0);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,&local_9e0,&local_a80);
  io::Printer::Emit(printer,local_760,10,0x1b1,
                    "\n        {\n          .defaultValue.$default_name$ = $default$,\n          .singletonName = GPBStringifySymbol($root_or_message_class_name$) \"_$method_name$\",\n          .extendedClass.clazz = $extended_type$,\n          .messageOrGroupClass.clazz = $type$,\n          .enumDescriptorFunc = $enum_desc_func_name$,\n          .fieldNumber = $number$,\n          .dataType = $extension_type$,\n          .options = $options$,\n        },\n      "
                   );
  lVar3 = 0x678;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_760[0].key_._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_a80);
  if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
    std::__cxx11::string::~string((string *)&local_ac0);
  }
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_a40);
  if (OVar2 == OBJECTIVECTYPE_ENUM) {
    std::__cxx11::string::~string((string *)&local_aa0);
  }
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_840);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&options);
  std::__cxx11::string::~string((string *)&containing_type);
  return;
}

Assistant:

void ExtensionGenerator::GenerateStaticVariablesInitialization(
    io::Printer* printer) const {
  const std::string containing_type = ClassName(descriptor_->containing_type());
  ObjectiveCType objc_type = GetObjectiveCType(descriptor_);

  std::vector<std::string> options;
  if (descriptor_->is_repeated()) options.push_back("GPBExtensionRepeated");
  if (descriptor_->is_packed()) options.push_back("GPBExtensionPacked");

  printer->Emit(
      {{"default",
        descriptor_->is_repeated() ? "nil" : DefaultValue(descriptor_)},
       {"default_name", GPBGenericValueFieldName(descriptor_)},
       {"enum_desc_func_name",
        objc_type == OBJECTIVECTYPE_ENUM
            ? absl::StrCat(EnumName(descriptor_->enum_type()),
                           "_EnumDescriptor")
            : "NULL"},
       {"extended_type", ObjCClass(containing_type)},
       {"extension_type",
        absl::StrCat("GPBDataType", GetCapitalizedType(descriptor_))},
       {"method_name", method_name_},
       {"number", descriptor_->number()},
       {"options", BuildFlagsString(FLAGTYPE_EXTENSION, options)},
       {"root_or_message_class_name", root_or_message_class_name_},
       {"type", objc_type == OBJECTIVECTYPE_MESSAGE
                    ? ObjCClass(ClassName(descriptor_->message_type()))
                    : "Nil"}},
      R"objc(
        {
          .defaultValue.$default_name$ = $default$,
          .singletonName = GPBStringifySymbol($root_or_message_class_name$) "_$method_name$",
          .extendedClass.clazz = $extended_type$,
          .messageOrGroupClass.clazz = $type$,
          .enumDescriptorFunc = $enum_desc_func_name$,
          .fieldNumber = $number$,
          .dataType = $extension_type$,
          .options = $options$,
        },
      )objc");
}